

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

int bio_inalign(opj_bio_t *bio)

{
  byte *pbVar1;
  int iVar2;
  
  bio->ct = 0;
  iVar2 = 0;
  if ((char)bio->buf == -1) {
    bio->buf = 0xff00;
    bio->ct = 7;
    pbVar1 = bio->bp;
    iVar2 = 1;
    if (pbVar1 < bio->end) {
      bio->bp = pbVar1 + 1;
      bio->buf = *pbVar1 | 0xff00;
      bio->ct = 0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int bio_inalign(opj_bio_t *bio) {
	bio->ct = 0;
	if ((bio->buf & 0xff) == 0xff) {
		if (bio_bytein(bio)) {
			return 1;
		}
		bio->ct = 0;
	}
	return 0;
}